

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProcess.cxx
# Opt level: O0

bool __thiscall cmProcess::Buffer::GetLine(Buffer *this,string *line)

{
  reference pvVar1;
  size_type sVar2;
  bool bVar3;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_68;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_60;
  const_iterator local_58;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_50;
  const_iterator local_48;
  long local_40;
  size_type length;
  reference local_30;
  char *text;
  size_type sz;
  string *line_local;
  Buffer *this_local;
  
  sz = (size_type)line;
  line_local = (string *)this;
  text = (char *)std::vector<char,_std::allocator<char>_>::size
                           (&this->super_vector<char,_std::allocator<char>_>);
  while( true ) {
    if ((char *)this->Last == text) {
      if (this->First != 0) {
        local_50._M_current =
             (char *)std::vector<char,_std::allocator<char>_>::begin
                               (&this->super_vector<char,_std::allocator<char>_>);
        __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
        __normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)
                   &local_48,&local_50);
        local_68._M_current =
             (char *)std::vector<char,_std::allocator<char>_>::begin
                               (&this->super_vector<char,_std::allocator<char>_>);
        local_60 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                   operator+(&local_68,this->First);
        __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
        __normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)
                   &local_58,&local_60);
        std::vector<char,_std::allocator<char>_>::erase
                  (&this->super_vector<char,_std::allocator<char>_>,local_48,local_58);
        this->First = 0;
        sVar2 = std::vector<char,_std::allocator<char>_>::size
                          (&this->super_vector<char,_std::allocator<char>_>);
        this->Last = sVar2;
      }
      return false;
    }
    pvVar1 = std::vector<char,_std::allocator<char>_>::operator[]
                       (&this->super_vector<char,_std::allocator<char>_>,this->Last);
    if ((*pvVar1 == '\n') ||
       (pvVar1 = std::vector<char,_std::allocator<char>_>::operator[]
                           (&this->super_vector<char,_std::allocator<char>_>,this->Last),
       *pvVar1 == '\0')) break;
    this->Last = this->Last + 1;
  }
  length = (size_type)
           std::vector<char,_std::allocator<char>_>::begin
                     (&this->super_vector<char,_std::allocator<char>_>);
  local_30 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
             operator*((__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> *)
                       &length);
  local_30 = local_30 + this->First;
  local_40 = this->Last - this->First;
  while( true ) {
    bVar3 = false;
    if (local_40 != 0) {
      bVar3 = local_30[local_40 + -1] == '\r';
    }
    if (!bVar3) break;
    local_40 = local_40 + -1;
  }
  std::__cxx11::string::assign((char *)sz,(ulong)local_30);
  this->Last = this->Last + 1;
  this->First = this->Last;
  return true;
}

Assistant:

bool cmProcess::Buffer::GetLine(std::string& line)
{
  // Scan for the next newline.
  for (size_type sz = this->size(); this->Last != sz; ++this->Last) {
    if ((*this)[this->Last] == '\n' || (*this)[this->Last] == '\0') {
      // Extract the range first..last as a line.
      const char* text = &*this->begin() + this->First;
      size_type length = this->Last - this->First;
      while (length && text[length - 1] == '\r') {
        length--;
      }
      line.assign(text, length);

      // Start a new range for the next line.
      ++this->Last;
      this->First = Last;

      // Return the line extracted.
      return true;
    }
  }

  // Available data have been exhausted without a newline.
  if (this->First != 0) {
    // Move the partial line to the beginning of the buffer.
    this->erase(this->begin(), this->begin() + this->First);
    this->First = 0;
    this->Last = this->size();
  }
  return false;
}